

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O3

void Wavegeneral_v(Mat *a,int JJ,int n,int isign,double *P,double *Q,int fsize)

{
  long *plVar1;
  long lVar2;
  int iVar3;
  undefined4 *puVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  undefined8 uVar14;
  double dVar15;
  
  if (fsize <= n) {
    uVar6 = n >> 1;
    if (isign < 0) {
      if (n < 1) {
        return;
      }
      iVar3 = uVar6 - fsize / 2;
      iVar7 = *(int *)(a + 8);
      plVar1 = *(long **)(a + 0x48);
      lVar11 = (long)JJ * 4 + *(long *)(a + 0x10);
      uVar12 = 0;
      do {
        iVar3 = iVar3 + 1;
        (Wavegeneral_v::b + uVar12)[0] = 0.0;
        (Wavegeneral_v::b + uVar12)[1] = 0.0;
        if (1 < fsize) {
          uVar14 = 0;
          lVar8 = (ulong)(uint)fsize + 2;
          iVar10 = iVar3;
          do {
            iVar5 = (int)((long)((ulong)(uint)((int)((long)iVar10 % (long)iVar7) >> 0x1f) << 0x20 |
                                (long)iVar10 % (long)iVar7 & 0xffffffffU) % (long)(int)uVar6);
            dVar13 = (double)*(float *)(lVar11 + *plVar1 * (long)iVar5);
            dVar15 = (double)*(float *)(lVar11 + (long)(int)(iVar5 + uVar6) * *plVar1);
            uVar14 = CONCAT44((float)(dVar13 * (P + lVar8 + -4)[1] + dVar15 * (Q + lVar8 + -4)[1] +
                                     (double)(float)((ulong)uVar14 >> 0x20)),
                              (float)(dVar13 * P[lVar8 + -4] + dVar15 * Q[lVar8 + -4] +
                                     (double)(float)uVar14));
            lVar8 = lVar8 + -2;
            iVar10 = iVar10 + 1;
          } while (3 < lVar8);
          *(undefined8 *)(Wavegeneral_v::b + uVar12) = uVar14;
        }
        uVar12 = uVar12 + 2;
      } while (uVar12 < (uint)n);
    }
    else {
      if (n < 1) {
        return;
      }
      plVar1 = *(long **)(a + 0x48);
      lVar11 = *(long *)(a + 0x10);
      uVar12 = 0;
      iVar7 = 0;
      do {
        lVar8 = uVar6 + uVar12;
        Wavegeneral_v::b[uVar12] = 0.0;
        Wavegeneral_v::b[lVar8] = 0.0;
        if (0 < fsize) {
          lVar2 = *plVar1;
          uVar9 = 0;
          do {
            dVar13 = (double)*(float *)((long)JJ * 4 + lVar11 +
                                       ((ulong)(uint)((int)uVar9 + iVar7) % (ulong)(uint)n) * lVar2)
            ;
            Wavegeneral_v::b[uVar12] = (float)(P[uVar9] * dVar13 + (double)Wavegeneral_v::b[uVar12])
            ;
            Wavegeneral_v::b[lVar8] = (float)(dVar13 * Q[uVar9] + (double)Wavegeneral_v::b[lVar8]);
            uVar9 = uVar9 + 1;
          } while ((uint)fsize != uVar9);
        }
        iVar7 = iVar7 + 2;
        uVar12 = uVar12 + 1;
      } while (uVar12 != (n - 1U >> 1) + 1);
    }
    if (0 < n) {
      lVar11 = **(long **)(a + 0x48);
      puVar4 = (undefined4 *)((long)JJ * 4 + *(long *)(a + 0x10));
      lVar8 = 0;
      do {
        *puVar4 = *(undefined4 *)((long)Wavegeneral_v::b + lVar8);
        lVar8 = lVar8 + 4;
        puVar4 = (undefined4 *)((long)puVar4 + lVar11);
      } while ((ulong)(uint)n << 2 != lVar8);
    }
  }
  return;
}

Assistant:

static void 
Wavegeneral_v(cv::Mat& a, int JJ, int n, int isign, double *P, double *Q, int fsize)
{
  static float b[1024];
	
  if (n < fsize) return;
  int nh = n >> 1;
	
  if (isign >= 0) 
  {
    for (int i = 0, j = 0; j < n; j+=2, ++i) 
    {
      b[i]=0.0f;
      b[i+nh]=0.0f;
			
      for(int k = 0; k < fsize; ++k) 
      {
        b[i] += P[k] * a.at<float>( (j+k)%n, JJ);
        b[i+nh] += Q[k] * a.at<float>( (j+k)%n, JJ);
      }
    }
  } 
  else 
  {
    for (int i = 0,r = nh-(fsize/2-1); i < n; r+=1, i+=2) 
    {
      b[i]=0.0f;
      b[i+1]=0.0f;
			
      for(int k = fsize-2, j = 0; k >= 0; k-=2, j+=1) 
      {
        b[i] += P[k] * a.at<float>(((r+j)%a.rows)%nh, JJ) + Q[k] * a.at<float>(nh+((r+j)%a.rows)%nh, JJ);
        b[i+1] += P[k+1] * a.at<float>(((r+j)%a.rows)%nh, JJ) + Q[k+1] * a.at<float>(nh+((r+j)%a.rows)%nh, JJ);
      }
    }
  }
  for(int i = 0; i < n; ++i)
    a.at<float>(i, JJ) = b[i];
}